

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O1

uint32_t WriteBinaryBone(aiBone *b)

{
  uint uVar1;
  uint32_t uVar2;
  uint i;
  uint32_t t;
  undefined4 local_38;
  uint local_34;
  
  local_38 = 0x123a;
  fwrite(&local_38,4,1,(FILE *)out);
  fwrite(&local_38,4,1,(FILE *)out);
  ftell((FILE *)out);
  uVar1 = (b->mName).length;
  fwrite(b,4,1,(FILE *)out);
  fwrite((b->mName).data,(ulong)uVar1,1,(FILE *)out);
  local_34 = b->mNumWeights;
  fwrite(&local_34,4,1,(FILE *)out);
  fwrite(&b->mOffsetMatrix,4,1,(FILE *)out);
  uVar2 = (*(code *)&LAB_002ed72b)(&b->mOffsetMatrix);
  return uVar2;
}

Assistant:

uint32_t WriteBinaryBone(const aiBone* b)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIBONE);

	len += Write<aiString>(b->mName);
	len += Write<unsigned int>(b->mNumWeights);
	len += Write<aiMatrix4x4>(b->mOffsetMatrix);

	// for the moment we write dumb min/max values for the bones, too.
	// maybe I'll add a better, hash-like solution later
	if (shortened) {
		len += WriteBounds(b->mWeights,b->mNumWeights);
	} // else write as usual
	else len += static_cast<uint32_t>(fwrite(b->mWeights,1,b->mNumWeights*sizeof(aiVertexWeight),out));

	ChangeInteger(old,len);
	return len;
}